

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

int __thiscall
ddd::DictionarySGL<false,_true>::stat(DictionarySGL<false,_true> *this,char *__file,stat *__buf)

{
  uint32_t uVar1;
  pointer pDVar2;
  size_t sVar3;
  
  *(size_t *)__file = this->num_keys_;
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)0x1599f9);
  uVar1 = DaTrie<false,_true,_false>::num_nodes((DaTrie<false,_true,_false> *)__file);
  (((DaTrie<false,_true,_false> *)__file)->bc_).
  super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(ulong)uVar1;
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)0x159a1b);
  uVar1 = DaTrie<false,_true,_false>::bc_size((DaTrie<false,_true,_false> *)0x159a23);
  *(ulong *)&(((DaTrie<false,_true,_false> *)__file)->tail_).
             super__Vector_base<char,_std::allocator<char>_>._M_impl = (ulong)uVar1;
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)0x159a3d);
  uVar1 = DaTrie<false,_true,_false>::bc_capa((DaTrie<false,_true,_false> *)0x159a45);
  *(ulong *)&(((DaTrie<false,_true,_false> *)__file)->tail_).
             super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = (ulong)uVar1;
  pDVar2 = std::
           unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
           ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                         *)0x159a5f);
  uVar1 = DaTrie<false,_true,_false>::bc_emps(pDVar2);
  *(ulong *)&(((DaTrie<false,_true,_false> *)__file)->tail_).
             super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = (ulong)uVar1;
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)0x159a81);
  uVar1 = DaTrie<false,_true,_false>::tail_size((DaTrie<false,_true,_false> *)0x159a89);
  (((DaTrie<false,_true,_false> *)__file)->blocks_).
  super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(ulong)uVar1;
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)0x159aa3);
  uVar1 = DaTrie<false,_true,_false>::tail_capa((DaTrie<false,_true,_false> *)0x159aab);
  (((DaTrie<false,_true,_false> *)__file)->blocks_).
  super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(ulong)uVar1;
  pDVar2 = std::
           unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
           ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                         *)0x159ac5);
  uVar1 = DaTrie<false,_true,_false>::tail_emps(pDVar2);
  (((DaTrie<false,_true,_false> *)__file)->blocks_).
  super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(ulong)uVar1;
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                *)0x159ae7);
  sVar3 = DaTrie<false,_true,_false>::size_in_bytes((DaTrie<false,_true,_false> *)__file);
  (((DaTrie<false,_true,_false> *)__file)->node_links_).
  super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(sVar3 + 8);
  return (int)__file;
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = trie_->num_nodes();
    ret.bc_size = trie_->bc_size();
    ret.bc_capa = trie_->bc_capa();
    ret.bc_emps = trie_->bc_emps();
    ret.tail_size = trie_->tail_size();
    ret.tail_capa = trie_->tail_capa();
    ret.tail_emps = trie_->tail_emps();
    ret.size_in_bytes = trie_->size_in_bytes() + sizeof(num_keys_);
  }